

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O2

bool Assimp::PLY::PropertyInstance::ParseInstanceBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,Property *prop,PropertyInstance *p_pcOut,bool p_bBE)

{
  uint uVar1;
  long lVar2;
  ValueUnion v;
  ValueUnion local_38;
  
  if (prop == (Property *)0x0) {
    __assert_fail("__null != prop",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x373,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Property *, PLY::PropertyInstance *, bool)"
                 );
  }
  if (p_pcOut != (PropertyInstance *)0x0) {
    if (prop->bIsList == true) {
      ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eFirstType,&local_38,p_bBE);
      uVar1 = ConvertTo<unsigned_int>(local_38,prop->eFirstType);
      std::
      vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ::resize(&p_pcOut->avList,(ulong)uVar1);
      for (lVar2 = 0; (ulong)uVar1 << 3 != lVar2; lVar2 = lVar2 + 8) {
        ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eType,
                         (ValueUnion *)
                         ((long)(p_pcOut->avList).
                                super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar2),p_bBE);
      }
    }
    else {
      ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eType,&local_38,p_bBE);
      std::
      vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ::push_back(&p_pcOut->avList,&local_38);
    }
    return true;
  }
  __assert_fail("__null != p_pcOut",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                ,0x374,
                "static bool Assimp::PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Property *, PLY::PropertyInstance *, bool)"
               );
}

Assistant:

bool PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  const PLY::Property* prop,
  PLY::PropertyInstance* p_pcOut,
  bool p_bBE)
{
  ai_assert(NULL != prop);
  ai_assert(NULL != p_pcOut);

  // parse all elements
  if (prop->bIsList)
  {
    // parse the number of elements in the list
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eFirstType, &v, p_bBE);

    // convert to unsigned int
    unsigned int iNum = PLY::PropertyInstance::ConvertTo<unsigned int>(v, prop->eFirstType);

    // parse all list elements
    p_pcOut->avList.resize(iNum);
    for (unsigned int i = 0; i < iNum; ++i)
    {
      PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eType, &p_pcOut->avList[i], p_bBE);
    }
  }
  else
  {
    // parse the property
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eType, &v, p_bBE);
    p_pcOut->avList.push_back(v);
  }
  return true;
}